

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiWindow::ImGuiWindow(ImGuiWindow *this,ImGuiContext *context,char *name)

{
  int *piVar1;
  undefined8 *puVar2;
  int iVar3;
  uint *puVar4;
  ImVec2 IVar5;
  ImU32 IVar6;
  ImGuiID IVar7;
  long lVar8;
  char *pcVar9;
  uint *__dest;
  size_t sVar10;
  int iVar11;
  int iVar12;
  
  (this->SizeContents).x = 0.0;
  (this->SizeContents).y = 0.0;
  (this->SizeContentsExplicit).x = 0.0;
  (this->SizeContentsExplicit).y = 0.0;
  (this->SizeFull).x = 0.0;
  (this->SizeFull).y = 0.0;
  (this->SizeFullAtLastBegin).x = 0.0;
  (this->SizeFullAtLastBegin).y = 0.0;
  (this->Pos).x = 0.0;
  (this->Pos).y = 0.0;
  (this->Size).x = 0.0;
  (this->Size).y = 0.0;
  (this->WindowPadding).x = 0.0;
  (this->WindowPadding).y = 0.0;
  (this->Scroll).x = 0.0;
  (this->Scroll).y = 0.0;
  (this->ScrollTarget).x = 0.0;
  (this->ScrollTarget).y = 0.0;
  (this->ScrollTargetCenterRatio).x = 0.0;
  (this->ScrollTargetCenterRatio).y = 0.0;
  (this->ScrollbarSizes).x = 0.0;
  (this->ScrollbarSizes).y = 0.0;
  (this->SetWindowPosVal).x = 0.0;
  (this->SetWindowPosVal).y = 0.0;
  (this->SetWindowPosPivot).x = 0.0;
  (this->SetWindowPosPivot).y = 0.0;
  ImGuiWindowTempData::ImGuiWindowTempData(&this->DC);
  (this->IDStack).Size = 0;
  (this->IDStack).Capacity = 0;
  (this->IDStack).Data = (uint *)0x0;
  (this->ClipRect).Min.x = 3.4028235e+38;
  (this->ClipRect).Min.y = 3.4028235e+38;
  (this->ClipRect).Max.x = -3.4028235e+38;
  (this->ClipRect).Max.y = -3.4028235e+38;
  (this->OuterRectClipped).Min.x = 3.4028235e+38;
  (this->OuterRectClipped).Min.y = 3.4028235e+38;
  (this->OuterRectClipped).Max.x = -3.4028235e+38;
  (this->OuterRectClipped).Max.y = -3.4028235e+38;
  (this->InnerMainRect).Min.x = 3.4028235e+38;
  (this->InnerMainRect).Min.y = 3.4028235e+38;
  (this->InnerMainRect).Max.x = -3.4028235e+38;
  (this->InnerMainRect).Max.y = -3.4028235e+38;
  (this->InnerClipRect).Min.x = 3.4028235e+38;
  (this->InnerClipRect).Min.y = 3.4028235e+38;
  (this->InnerClipRect).Max.x = -3.4028235e+38;
  (this->InnerClipRect).Max.y = -3.4028235e+38;
  (this->ContentsRegionRect).Min.x = 3.4028235e+38;
  (this->ContentsRegionRect).Min.y = 3.4028235e+38;
  (this->ContentsRegionRect).Max.x = -3.4028235e+38;
  (this->ContentsRegionRect).Max.y = -3.4028235e+38;
  ImGuiMenuColumns::ImGuiMenuColumns(&this->MenuColumns);
  (this->ColumnsStorage).Size = 0;
  (this->ColumnsStorage).Capacity = 0;
  (this->ColumnsStorage).Data = (ImGuiColumns *)0x0;
  (this->StateStorage).Data.Size = 0;
  (this->StateStorage).Data.Capacity = 0;
  (this->StateStorage).Data.Data = (Pair *)0x0;
  ImDrawList::ImDrawList(&this->DrawListInst,&context->DrawListSharedData);
  lVar8 = 0x394;
  do {
    puVar2 = (undefined8 *)((long)this + lVar8 + -0xc);
    *puVar2 = 0x7f7fffff7f7fffff;
    puVar2[1] = 0xff7fffffff7fffff;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x3b4);
  pcVar9 = ImStrdup(name);
  this->Name = pcVar9;
  IVar6 = ImHashStr(name,0,0);
  this->ID = IVar6;
  iVar12 = (this->IDStack).Size;
  iVar3 = (this->IDStack).Capacity;
  if (iVar12 == iVar3) {
    iVar12 = iVar12 + 1;
    if (iVar3 == 0) {
      iVar11 = 8;
    }
    else {
      iVar11 = iVar3 / 2 + iVar3;
    }
    if (iVar12 < iVar11) {
      iVar12 = iVar11;
    }
    if (iVar3 < iVar12) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (uint *)(*GImAllocatorAllocFunc)((long)iVar12 << 2,GImAllocatorUserData);
      puVar4 = (this->IDStack).Data;
      if (puVar4 != (uint *)0x0) {
        memcpy(__dest,puVar4,(long)(this->IDStack).Size << 2);
        puVar4 = (this->IDStack).Data;
        if ((puVar4 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar4,GImAllocatorUserData);
      }
      (this->IDStack).Data = __dest;
      (this->IDStack).Capacity = iVar12;
    }
  }
  (this->IDStack).Data[(this->IDStack).Size] = this->ID;
  (this->IDStack).Size = (this->IDStack).Size + 1;
  this->Flags = 0;
  (this->Pos).x = 0.0;
  *(undefined8 *)&(this->Pos).y = 0;
  (this->Size).x = 0.0;
  (this->Size).y = 0.0;
  (this->SizeFull).x = 0.0;
  (this->SizeFull).y = 0.0;
  (this->SizeContents).x = 0.0;
  (this->SizeContents).y = 0.0;
  (this->SizeContentsExplicit).x = 0.0;
  (this->SizeContentsExplicit).y = 0.0;
  (this->WindowPadding).x = 0.0;
  (this->WindowPadding).y = 0.0;
  this->WindowRounding = 0.0;
  this->WindowBorderSize = 0.0;
  sVar10 = strlen(name);
  this->NameBufLen = (int)sVar10 + 1;
  IVar7 = GetID(this,"#MOVE",(char *)0x0);
  this->MoveId = IVar7;
  this->ChildId = 0;
  (this->Scroll).x = 0.0;
  *(undefined8 *)&(this->Scroll).y = 0x7f7fffff00000000;
  *(undefined8 *)&(this->ScrollTarget).y = 0x3f0000007f7fffff;
  (this->ScrollTargetCenterRatio).y = 0.5;
  (this->ScrollbarSizes).x = 0.0;
  (this->ScrollbarSizes).y = 0.0;
  this->ScrollbarX = false;
  this->ScrollbarY = false;
  this->Active = false;
  this->WasActive = false;
  this->WriteAccessed = false;
  this->Collapsed = false;
  this->WantCollapseToggle = false;
  this->SkipItems = false;
  this->SkipItems = false;
  this->Appearing = false;
  this->Hidden = false;
  this->HasCloseButton = false;
  this->ResizeBorderHeld = -1;
  this->BeginCount = 0;
  this->BeginOrderWithinParent = -1;
  this->BeginOrderWithinContext = -1;
  this->PopupId = 0;
  this->AutoFitFramesX = -1;
  this->AutoFitFramesY = -1;
  this->AutoFitOnlyGrows = false;
  this->AutoFitChildAxises = 0;
  this->AutoPosLastDirection = -1;
  this->HiddenFramesCanSkipItems = 0;
  this->HiddenFramesCannotSkipItems = 0;
  this->SetWindowSizeAllowFlags = 0xf;
  this->SetWindowCollapsedAllowFlags = 0xf;
  this->SetWindowPosAllowFlags = 0xf;
  (this->SetWindowPosPivot).x = 3.4028235e+38;
  (this->SetWindowPosPivot).y = 3.4028235e+38;
  (this->SetWindowPosVal).x = 3.4028235e+38;
  (this->SetWindowPosVal).y = 3.4028235e+38;
  this->LastFrameActive = -1;
  this->ItemWidthDefault = 0.0;
  this->FontWindowScale = 1.0;
  this->SettingsIdx = -1;
  this->DrawList = &this->DrawListInst;
  (this->DrawListInst)._OwnerName = this->Name;
  this->RootWindowForTitleBarHighlight = (ImGuiWindow *)0x0;
  this->RootWindowForNav = (ImGuiWindow *)0x0;
  this->ParentWindow = (ImGuiWindow *)0x0;
  this->RootWindow = (ImGuiWindow *)0x0;
  this->NavRectRel[1].Min.x = 3.4028235e+38;
  this->NavRectRel[1].Min.y = 3.4028235e+38;
  this->NavRectRel[1].Max.x = -3.4028235e+38;
  this->NavRectRel[1].Max.y = -3.4028235e+38;
  IVar5 = this->NavRectRel[1].Max;
  this->NavRectRel[0].Min = this->NavRectRel[1].Min;
  this->NavRectRel[0].Max = IVar5;
  this->NavLastChildNavWindow = (ImGuiWindow *)0x0;
  this->NavLastIds[0] = 0;
  this->NavLastIds[1] = 0;
  return;
}

Assistant:

ImGuiWindow::ImGuiWindow(ImGuiContext* context, const char* name)
    : DrawListInst(&context->DrawListSharedData)
{
    Name = ImStrdup(name);
    ID = ImHashStr(name);
    IDStack.push_back(ID);
    Flags = ImGuiWindowFlags_None;
    Pos = ImVec2(0.0f, 0.0f);
    Size = SizeFull = ImVec2(0.0f, 0.0f);
    SizeContents = SizeContentsExplicit = ImVec2(0.0f, 0.0f);
    WindowPadding = ImVec2(0.0f, 0.0f);
    WindowRounding = 0.0f;
    WindowBorderSize = 0.0f;
    NameBufLen = (int)strlen(name) + 1;
    MoveId = GetID("#MOVE");
    ChildId = 0;
    Scroll = ImVec2(0.0f, 0.0f);
    ScrollTarget = ImVec2(FLT_MAX, FLT_MAX);
    ScrollTargetCenterRatio = ImVec2(0.5f, 0.5f);
    ScrollbarSizes = ImVec2(0.0f, 0.0f);
    ScrollbarX = ScrollbarY = false;
    Active = WasActive = false;
    WriteAccessed = false;
    Collapsed = false;
    WantCollapseToggle = false;
    SkipItems = false;
    Appearing = false;
    Hidden = false;
    HasCloseButton = false;
    ResizeBorderHeld = -1;
    BeginCount = 0;
    BeginOrderWithinParent = -1;
    BeginOrderWithinContext = -1;
    PopupId = 0;
    AutoFitFramesX = AutoFitFramesY = -1;
    AutoFitOnlyGrows = false;
    AutoFitChildAxises = 0x00;
    AutoPosLastDirection = ImGuiDir_None;
    HiddenFramesCanSkipItems = HiddenFramesCannotSkipItems = 0;
    SetWindowPosAllowFlags = SetWindowSizeAllowFlags = SetWindowCollapsedAllowFlags = ImGuiCond_Always | ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing;
    SetWindowPosVal = SetWindowPosPivot = ImVec2(FLT_MAX, FLT_MAX);

    LastFrameActive = -1;
    ItemWidthDefault = 0.0f;
    FontWindowScale = 1.0f;
    SettingsIdx = -1;

    DrawList = &DrawListInst;
    DrawList->_OwnerName = Name;
    ParentWindow = NULL;
    RootWindow = NULL;
    RootWindowForTitleBarHighlight = NULL;
    RootWindowForNav = NULL;

    NavLastIds[0] = NavLastIds[1] = 0;
    NavRectRel[0] = NavRectRel[1] = ImRect();
    NavLastChildNavWindow = NULL;
}